

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O0

void set_key(cf_chacha20_ctx *ctx,uint8_t *key,size_t nkey)

{
  size_t nkey_local;
  uint8_t *key_local;
  cf_chacha20_ctx *ctx_local;
  
  if (nkey == 0x10) {
    *(undefined8 *)ctx->key0 = *(undefined8 *)key;
    *(undefined8 *)(ctx->key0 + 8) = *(undefined8 *)(key + 8);
    *(undefined8 *)ctx->key1 = *(undefined8 *)key;
    *(undefined8 *)(ctx->key1 + 8) = *(undefined8 *)(key + 8);
    ctx->constant = chacha20_tau;
  }
  else {
    if (nkey != 0x20) {
      abort();
    }
    *(undefined8 *)ctx->key0 = *(undefined8 *)key;
    *(undefined8 *)(ctx->key0 + 8) = *(undefined8 *)(key + 8);
    *(undefined8 *)ctx->key1 = *(undefined8 *)(key + 0x10);
    *(undefined8 *)(ctx->key1 + 8) = *(undefined8 *)(key + 0x18);
    ctx->constant = chacha20_sigma;
  }
  return;
}

Assistant:

static void set_key(cf_chacha20_ctx *ctx, const uint8_t *key, size_t nkey)
{
  switch (nkey)
  {
    case 16:
      memcpy(ctx->key0, key, 16);
      memcpy(ctx->key1, key, 16);
      ctx->constant = chacha20_tau;
      break;
    case 32:
      memcpy(ctx->key0, key, 16);
      memcpy(ctx->key1, key + 16, 16);
      ctx->constant = chacha20_sigma;
      break;
    default:
      abort();
  }
}